

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  int iVar1;
  char buf [7];
  int fds [2];
  FdInputStream in;
  FdOutputStream out;
  undefined4 local_b7;
  char acStack_b3 [2];
  char local_b1;
  AutoCloseFd local_b0;
  int local_a8;
  int local_a4;
  FdInputStream local_a0;
  AutoCloseFd local_88;
  FdOutputStream local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    iVar1 = pipe(&local_a8);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    local_b0.fd = local_a8;
    UnwindDetector::UnwindDetector(&local_b0.unwindDetector);
    FdInputStream::FdInputStream(&local_a0,&local_b0);
    AutoCloseFd::~AutoCloseFd(&local_b0);
    local_88.fd = local_a4;
    UnwindDetector::UnwindDetector(&local_88.unwindDetector);
    FdOutputStream::FdOutputStream(&local_80,&local_88);
    AutoCloseFd::~AutoCloseFd(&local_88);
    local_68 = 0;
    uStack_60 = 0;
    local_58 = "foo";
    local_50 = 3;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = "bar";
    local_30 = 3;
    local_28 = 0;
    uStack_20 = 0;
    FdOutputStream::write(&local_80,(int)&local_68,(void *)0x5,0x190003);
    InputStream::read(&local_a0.super_InputStream,(int)(char (*) [7])&local_b7,(void *)0x6,6);
    local_b1 = '\0';
    if ((CONCAT21(acStack_b3,local_b7._3_1_) != 0x726162 || local_b7 != 0x626f6f66) &&
       (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[7]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
                 ,0x3a,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
                 (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
                 (char (*) [7])"foobar",(char (*) [7])&local_b7);
    }
    FdOutputStream::~FdOutputStream(&local_80);
    FdInputStream::~FdInputStream(&local_a0);
    return;
  }
  local_a0.super_InputStream._vptr_InputStream = (_func_int **)0x0;
  local_68 = 0;
  uStack_60 = 0;
  _::Debug::Fault::init
            ((Fault *)&local_a0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
            );
  _::Debug::Fault::fatal((Fault *)&local_a0);
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2];
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((AutoCloseFd(fds[0])));
  FdOutputStream out((AutoCloseFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("foo"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("bar"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  char buf[7];
  in.read(buf, 6);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}